

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeCompileInfo
                 (qpTestLog *log,char *name,char *description,deBool compileOk,char *infoLog)

{
  deBool dVar1;
  char *value;
  undefined1 local_108 [16];
  char *local_f8;
  char *local_f0;
  undefined1 local_e8 [16];
  char *local_d8;
  char *local_d0;
  undefined1 local_c8 [16];
  char *local_b8;
  char *local_b0;
  undefined1 local_a8 [8];
  qpXmlAttribute attribs [3];
  int numAttribs;
  char *infoLog_local;
  deBool compileOk_local;
  char *description_local;
  char *name_local;
  qpTestLog *log_local;
  
  deMutex_lock(log->lock);
  qpSetStringAttrib((qpXmlAttribute *)local_c8,"Name",name);
  local_a8 = (undefined1  [8])local_c8._0_8_;
  attribs[0].name = (char *)local_c8._8_8_;
  attribs[0]._8_8_ = local_b8;
  attribs[0].stringValue = local_b0;
  qpSetStringAttrib((qpXmlAttribute *)local_e8,"Description",description);
  attribs[0].intValue = local_e8._0_4_;
  attribs[0].boolValue = local_e8._4_4_;
  attribs[1].name = (char *)local_e8._8_8_;
  attribs[1]._8_8_ = local_d8;
  attribs[1].stringValue = local_d0;
  value = "Fail";
  if (compileOk != 0) {
    value = "OK";
  }
  qpSetStringAttrib((qpXmlAttribute *)local_108,"CompileStatus",value);
  attribs[1].intValue = local_108._0_4_;
  attribs[1].boolValue = local_108._4_4_;
  attribs[2].name = (char *)local_108._8_8_;
  attribs[2]._8_8_ = local_f8;
  attribs[2].stringValue = local_f0;
  dVar1 = qpXmlWriter_startElement(log->writer,"CompileInfo",3,(qpXmlAttribute *)local_a8);
  if (((dVar1 != 0) &&
      (dVar1 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",infoLog), dVar1 != 0)) &&
     (dVar1 = qpXmlWriter_endElement(log->writer,"CompileInfo"), dVar1 != 0)) {
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_writeCompileInfo(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

deBool qpTestLog_writeCompileInfo (qpTestLog* log, const char* name, const char* description, deBool compileOk, const char* infoLog)
{
	int				numAttribs = 0;
	qpXmlAttribute	attribs[3];

	DE_ASSERT(log && name && description && infoLog);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	attribs[numAttribs++] = qpSetStringAttrib("CompileStatus", compileOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, "CompileInfo", numAttribs, attribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", infoLog) ||
		!qpXmlWriter_endElement(log->writer, "CompileInfo"))
	{
		qpPrintf("qpTestLog_writeCompileInfo(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}